

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int in_EDX;
  Mat *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  int i_6;
  int i_5;
  float *ptr_4;
  int q_5;
  int j_3;
  int j_2;
  float *mins_ptr_1;
  int q_4;
  int j_1;
  int i_4;
  float *mins_ptr;
  float *ptr_3;
  int q_3;
  Mat mins;
  int j;
  float sum_3;
  int i_3;
  float *outptr;
  float *ptr_2;
  int q_2;
  int i_2;
  float sum_2;
  float *ptr_1;
  int q_1;
  int i_1;
  float sum;
  int i;
  float sum_1;
  float *ptr;
  int q;
  Mat sums;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  plus<float> op2;
  plus<float> op;
  Allocator *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  Mat *in_stack_fffffffffffffc18;
  Mat *this;
  Mat *in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  Mat *in_stack_fffffffffffffc30;
  int local_340;
  int local_33c;
  Mat local_338;
  float *local_300;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  Mat local_2e8;
  float *local_2b0;
  int local_2a4;
  int local_2a0;
  int local_29c;
  Mat local_298;
  float *local_260;
  Mat local_258;
  float *local_220;
  int local_214;
  int local_1d4;
  float local_1d0;
  int local_1cc;
  Mat local_1c8;
  float *local_190;
  Mat local_188;
  float *local_150;
  int local_144;
  int local_140;
  float local_13c;
  Mat local_138;
  float *local_100;
  int local_f4;
  int local_f0;
  float local_ec;
  int local_e8;
  float local_e4;
  Mat local_e0;
  float *local_a8;
  int local_9c;
  int local_98;
  Mat local_88;
  int local_4c;
  undefined8 local_48;
  int local_40;
  int local_3c;
  int local_38;
  plus<float> local_32;
  plus<float> local_31 [13];
  float local_24;
  int local_20;
  float local_1c;
  Mat *local_18;
  int local_4;
  
  local_38 = *(int *)(in_RDI + 0x24);
  local_3c = *(int *)(in_RDI + 0x28);
  local_40 = *(int *)(in_RDI + 0x2c);
  local_48 = *(undefined8 *)(in_RDI + 0x10);
  local_4c = local_38 * local_3c;
  local_24 = in_XMM1_Da;
  local_20 = in_EDX;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  if (in_EDX == 0) {
    Mat::create(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                (size_t)in_stack_fffffffffffffc20,(Allocator *)in_stack_fffffffffffffc18);
  }
  else if (in_EDX == 1) {
    Mat::create(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                (size_t)in_stack_fffffffffffffc20,(Allocator *)in_stack_fffffffffffffc18);
  }
  else if (in_EDX == 2) {
    Mat::create(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28,
                (size_t)in_stack_fffffffffffffc20,(Allocator *)in_stack_fffffffffffffc18);
  }
  else if (in_EDX == -1) {
    Mat::create(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                (size_t)in_stack_fffffffffffffc20,(Allocator *)in_stack_fffffffffffffc18);
  }
  else if (in_EDX == -2) {
    Mat::create(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28,
                (size_t)in_stack_fffffffffffffc20,(Allocator *)in_stack_fffffffffffffc18);
  }
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  if (bVar1) {
    return -100;
  }
  fVar3 = (float)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  if (local_20 == 0) {
    Mat::Mat(in_stack_fffffffffffffc20,(int)fVar3,
             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),in_stack_fffffffffffffc08
            );
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      for (local_9c = 0; local_9c < local_40; local_9c = local_9c + 1) {
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_e0);
        Mat::~Mat((Mat *)0x12810d);
        local_e4 = local_1c;
        local_a8 = pfVar2;
        for (local_e8 = 0; fVar3 = local_e4, local_e8 < local_4c; local_e8 = local_e8 + 1) {
          local_e4 = std::plus<float>::operator()(local_31,&local_e4,local_a8 + local_e8);
        }
        pfVar2 = Mat::operator[](&local_88,local_9c);
        *pfVar2 = fVar3;
      }
      local_ec = local_1c;
      for (local_f0 = 0; local_f0 < local_40; local_f0 = local_f0 + 1) {
        pfVar2 = Mat::operator[](&local_88,local_f0);
        local_ec = std::plus<float>::operator()(&local_32,&local_ec,pfVar2);
      }
      fVar3 = local_ec * local_24;
      pfVar2 = Mat::operator[](local_18,0);
      *pfVar2 = fVar3;
      local_98 = 0;
    }
    Mat::~Mat((Mat *)0x1282ea);
  }
  else {
    if (local_20 == 1) {
      for (local_f4 = 0; local_f4 < local_40; local_f4 = local_f4 + 1) {
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_138);
        Mat::~Mat((Mat *)0x128388);
        local_13c = local_1c;
        local_100 = pfVar2;
        for (local_140 = 0; local_140 < local_4c; local_140 = local_140 + 1) {
          local_13c = std::plus<float>::operator()(local_31,&local_13c,local_100 + local_140);
        }
        fVar3 = local_13c * local_24;
        pfVar2 = Mat::operator[](local_18,local_f4);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if (local_20 == 2) {
      for (local_144 = 0; local_144 < local_40; local_144 = local_144 + 1) {
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_188);
        Mat::~Mat((Mat *)0x1284f0);
        local_150 = pfVar2;
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_1c8);
        Mat::~Mat((Mat *)0x12853c);
        local_190 = pfVar2;
        for (local_1cc = 0; local_1cc < local_3c; local_1cc = local_1cc + 1) {
          local_1d0 = local_1c;
          for (local_1d4 = 0; local_1d4 < local_38; local_1d4 = local_1d4 + 1) {
            local_1d0 = std::plus<float>::operator()(local_31,&local_1d0,local_150 + local_1cc);
          }
          local_190[local_1cc] = local_1d0 * local_24;
          local_150 = local_150 + local_38;
        }
      }
      return 0;
    }
    if (local_20 != -1) {
      if (local_20 != -2) {
        return 0;
      }
      Mat::fill(in_stack_fffffffffffffc20,fVar3);
      for (local_2f4 = 0; local_2f4 < local_40; local_2f4 = local_2f4 + 1) {
        this = &local_338;
        Mat::channel(this,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(this);
        Mat::~Mat((Mat *)0x128bc6);
        local_300 = pfVar2;
        for (local_33c = 0; local_33c < local_4c; local_33c = local_33c + 1) {
          pfVar2 = Mat::operator[](local_18,local_33c);
          in_stack_fffffffffffffc14 =
               std::plus<float>::operator()(local_31,pfVar2,local_300 + local_33c);
          pfVar2 = Mat::operator[](local_18,local_33c);
          *pfVar2 = in_stack_fffffffffffffc14;
        }
      }
      for (local_340 = 0; local_340 < local_4c; local_340 = local_340 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_340);
        *pfVar2 = fVar3 * *pfVar2;
      }
      return 0;
    }
    Mat::Mat(in_stack_fffffffffffffc20,(int)fVar3,(int)in_stack_fffffffffffffc18,
             (int)in_stack_fffffffffffffc14,(size_t)in_stack_fffffffffffffc08,(Allocator *)0x1286ef)
    ;
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      Mat::fill(in_stack_fffffffffffffc20,(float)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      for (local_214 = 0; local_214 < local_40; local_214 = local_214 + 1) {
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_258);
        Mat::~Mat((Mat *)0x1287b3);
        local_220 = pfVar2;
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_298);
        Mat::~Mat((Mat *)0x1287ff);
        local_260 = pfVar2;
        for (local_29c = 0; local_29c < local_3c; local_29c = local_29c + 1) {
          for (local_2a0 = 0; local_2a0 < local_38; local_2a0 = local_2a0 + 1) {
            fVar3 = std::plus<float>::operator()
                              (local_31,local_260 + local_2a0,local_220 + local_29c);
            local_260[local_2a0] = fVar3;
          }
          local_220 = local_220 + local_38;
        }
      }
      Mat::fill(in_stack_fffffffffffffc20,(float)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      for (local_2a4 = 0; local_2a4 < local_40; local_2a4 = local_2a4 + 1) {
        Mat::channel(in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc14);
        pfVar2 = Mat::operator_cast_to_float_(&local_2e8);
        Mat::~Mat((Mat *)0x1289c6);
        local_2b0 = pfVar2;
        for (local_2ec = 0; local_2ec < local_38; local_2ec = local_2ec + 1) {
          pfVar2 = Mat::operator[](local_18,local_2ec);
          fVar3 = std::plus<float>::operator()(&local_32,pfVar2,local_2b0 + local_2ec);
          pfVar2 = Mat::operator[](local_18,local_2ec);
          *pfVar2 = fVar3;
        }
      }
      for (local_2f0 = 0; local_2f0 < local_38; local_2f0 = local_2f0 + 1) {
        fVar3 = local_24;
        pfVar2 = Mat::operator[](local_18,local_2f0);
        *pfVar2 = fVar3 * *pfVar2;
      }
      local_98 = 0;
    }
    Mat::~Mat((Mat *)0x128b1b);
  }
  if (local_98 == 0) {
    return 0;
  }
  return local_4;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff, const Option& opt)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    size_t elemsize = a.elemsize;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1, elemsize, opt.blob_allocator);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels, elemsize, opt.blob_allocator);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels, elemsize, opt.blob_allocator);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w, elemsize, opt.blob_allocator);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h, elemsize, opt.blob_allocator);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels, elemsize, opt.workspace_allocator);
        if (sums.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}